

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O0

int xz_avail(xz_statep state)

{
  int iVar1;
  uint local_24;
  lzma_stream *plStack_20;
  uint tmp;
  lzma_stream *strm;
  xz_statep state_local;
  
  plStack_20 = &state->strm;
  if (state->err == 0) {
    if (state->eof == 0) {
      local_24 = (uint)(state->strm).avail_in;
      strm = (lzma_stream *)state;
      iVar1 = xz_load(state,state->in,state->size,&local_24);
      if (iVar1 == -1) {
        plStack_20->avail_in = (ulong)local_24;
        return -1;
      }
      plStack_20->avail_in = (ulong)local_24;
      plStack_20->next_in = (uint8_t *)strm->avail_out;
    }
    state_local._4_4_ = 0;
  }
  else {
    state_local._4_4_ = -1;
  }
  return state_local._4_4_;
}

Assistant:

static int
xz_avail(xz_statep state)
{
    lzma_stream *strm = &(state->strm);

    if (state->err != LZMA_OK)
        return -1;
    if (state->eof == 0) {
        /* avail_in is size_t, which is not necessary sizeof(unsigned) */
        unsigned tmp = strm->avail_in;

        if (xz_load(state, state->in, state->size, &tmp) == -1) {
            strm->avail_in = tmp;
            return -1;
        }
        strm->avail_in = tmp;
        strm->next_in = state->in;
    }
    return 0;
}